

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::checkForDuplicateFunctions
          (SanityCheckPass *this,ArrayView<soul::pool_ref<soul::AST::Function>_> functions)

{
  ASTUtilities *this_00;
  long lVar1;
  bool bVar2;
  Function *extraout_RDX;
  Function *extraout_RDX_00;
  Function *f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  functionSigs;
  string newSig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_78;
  CompileMessage local_58;
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_98,(long)functions.s - (long)this >> 3);
  f = extraout_RDX;
  do {
    if (this == (SanityCheckPass *)functions.s) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      return;
    }
    this_00 = *(ASTUtilities **)this;
    if (*(long *)(this_00 + 0x70) == *(long *)(this_00 + 0x78)) {
      ASTUtilities::getFunctionSignature_abi_cxx11_(&local_78,this_00,f);
      bVar2 = contains<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&>
                        (&local_98,&local_78);
      if (bVar2) {
        lVar1 = *(long *)this;
        Errors::duplicateFunction<>();
        AST::Context::throwError((Context *)(lVar1 + 0x10),&local_58,false);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_98,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      f = extraout_RDX_00;
    }
    this = this + 8;
  } while( true );
}

Assistant:

static void checkForDuplicateFunctions (ArrayView<pool_ref<AST::Function>> functions)
    {
        std::vector<std::string> functionSigs;
        functionSigs.reserve (functions.size());

        for (auto& f : functions)
        {
            if (! f->isGeneric())
            {
                auto newSig = ASTUtilities::getFunctionSignature (f);

                if (contains (functionSigs, newSig))
                    f->context.throwError (Errors::duplicateFunction());

                functionSigs.push_back (newSig);
            }
        }
    }